

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

double binary_fuse_calculate_size_factor(uint32_t arity,uint32_t size)

{
  uint in_ESI;
  int in_EDI;
  double dVar1;
  double dVar2;
  undefined8 local_8;
  
  if (in_EDI == 3) {
    dVar1 = log(1000000.0);
    dVar2 = log((double)in_ESI);
    local_8 = binary_fuse_max(1.125,(dVar1 * 0.25) / dVar2 + 0.875);
  }
  else if (in_EDI == 4) {
    dVar1 = log(600000.0);
    dVar2 = log((double)in_ESI);
    local_8 = binary_fuse_max(1.075,(dVar1 * 0.305) / dVar2 + 0.77);
  }
  else {
    local_8 = 2.0;
  }
  return local_8;
}

Assistant:

static inline double binary_fuse_calculate_size_factor(uint32_t arity,
                                                        uint32_t size) {
  if (arity == 3) {
    return binary_fuse_max(1.125, 0.875 + 0.25 * log(1000000.0) / log((double)size));
  } else if (arity == 4) {
    return binary_fuse_max(1.075, 0.77 + 0.305 * log(600000.0) / log((double)size));
  } else {
    return 2.0;
  }
}